

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_window_expression.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundWindowExpression::Copy(BoundWindowExpression *this)

{
  WindowBoundary WVar1;
  WindowExcludeMode WVar2;
  bool bVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Head_base<0UL,_duckdb::AggregateFunction_*,_false> _Var5;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var6;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar7;
  element_type *peVar8;
  _func_int **pp_Var9;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var10;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var11;
  long lVar12;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *puVar13;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var14;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var15;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> _Var16;
  pointer pBVar17;
  type pAVar18;
  _Head_base<0UL,_duckdb::AggregateFunction_*,_false> this_00;
  pointer pFVar19;
  pointer pEVar20;
  long lVar21;
  Expression *in_RSI;
  aggregate_size_t *pp_Var22;
  aggregate_size_t *pp_Var23;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *child;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar24;
  element_type *this_01;
  _func_int **__args;
  BaseStatistics *__args_00;
  unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *this_02;
  byte bVar25;
  templated_unique_single_t new_window;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_50;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_48;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_40;
  bool local_38;
  bool bStack_37;
  undefined6 uStack_36;
  
  bVar25 = 0;
  local_50._M_head_impl = (Expression *)0x0;
  local_38 = false;
  bStack_37 = false;
  uStack_36 = 0;
  local_40._M_head_impl = &this->super_Expression;
  make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType_const&,duckdb::LogicalType_const&,decltype(nullptr),decltype(nullptr)>
            ((ExpressionType *)&stack0xffffffffffffffb8,
             (LogicalType *)&(in_RSI->super_BaseExpression).type,(void **)&in_RSI->return_type,
             &stack0xffffffffffffffb0._M_head_impl);
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  Expression::CopyProperties(&pBVar17->super_Expression,in_RSI);
  if (in_RSI[1].super_BaseExpression._vptr_BaseExpression != (_func_int **)0x0) {
    pAVar18 = unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
              ::operator*((unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>,_true>
                           *)(in_RSI + 1));
    this_00._M_head_impl = (AggregateFunction *)operator_new(0x130);
    SimpleFunction::SimpleFunction((SimpleFunction *)this_00._M_head_impl,(SimpleFunction *)pAVar18)
    ;
    *(undefined ***)&(this_00._M_head_impl)->super_BaseScalarFunction =
         &PTR__BaseScalarFunction_0248aa80;
    LogicalType::LogicalType
              ((LogicalType *)&((this_00._M_head_impl)->super_BaseScalarFunction).return_type,
               &(pAVar18->super_BaseScalarFunction).return_type);
    *(undefined4 *)&((this_00._M_head_impl)->super_BaseScalarFunction).stability =
         *(undefined4 *)&(pAVar18->super_BaseScalarFunction).stability;
    *(undefined ***)&(this_00._M_head_impl)->super_BaseScalarFunction =
         &PTR__AggregateFunction_0247e830;
    pp_Var22 = &pAVar18->state_size;
    pp_Var23 = &(this_00._M_head_impl)->state_size;
    for (lVar21 = 0xd; lVar21 != 0; lVar21 = lVar21 + -1) {
      *pp_Var23 = *pp_Var22;
      pp_Var22 = pp_Var22 + (ulong)bVar25 * -2 + 1;
      pp_Var23 = pp_Var23 + (ulong)bVar25 * -2 + 1;
    }
    *(undefined2 *)
     &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(this_00._M_head_impl)->order_dependent)->
      _M_pi = *(undefined2 *)&pAVar18->order_dependent;
    (((SimpleFunction *)&(this_00._M_head_impl)->function_info)->super_Function)._vptr_Function =
         (_func_int **)
         (pAVar18->function_info).internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var4 = (pAVar18->function_info).internal.
             super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (((string *)
     &((this_00._M_head_impl)->function_info).internal.
      super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount)->
    _M_dataplus)._M_p = (pointer)p_Var4;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&stack0xffffffffffffffb8);
    _Var5._M_head_impl =
         (pBVar17->aggregate).
         super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
         .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl;
    (pBVar17->aggregate).
    super_unique_ptr<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::AggregateFunction,_std::default_delete<duckdb::AggregateFunction>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::AggregateFunction_*,_std::default_delete<duckdb::AggregateFunction>_>
    .super__Head_base<0UL,_duckdb::AggregateFunction_*,_false>._M_head_impl = this_00._M_head_impl;
    if (_Var5._M_head_impl != (AggregateFunction *)0x0) {
      (**(code **)(*(long *)&(_Var5._M_head_impl)->super_BaseScalarFunction + 8))();
    }
  }
  lVar21._0_1_ = in_RSI[1].super_BaseExpression.type;
  lVar21._1_1_ = in_RSI[1].super_BaseExpression.expression_class;
  lVar21._2_6_ = *(undefined6 *)&in_RSI[1].super_BaseExpression.field_0xa;
  if (lVar21 != 0) {
    pFVar19 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
              operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                          *)&in_RSI[1].super_BaseExpression.type);
    (*pFVar19->_vptr_FunctionData[2])(&stack0xffffffffffffffb0,pFVar19);
    pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&stack0xffffffffffffffb8);
    _Var14._M_head_impl = (FunctionData *)local_50._M_head_impl;
    local_50._M_head_impl = (Expression *)0x0;
    _Var6._M_head_impl =
         (pBVar17->bind_info).
         super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
         super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
         _M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    (pBVar17->bind_info).
    super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
    super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = _Var14._M_head_impl;
    if (_Var6._M_head_impl != (FunctionData *)0x0) {
      (*(_Var6._M_head_impl)->_vptr_FunctionData[1])();
    }
    if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
      (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
  }
  puVar24 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
            in_RSI[1].super_BaseExpression.alias._M_dataplus._M_p;
  puVar7 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           in_RSI[1].super_BaseExpression.alias._M_string_length;
  if (puVar24 != puVar7) {
    do {
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar24);
      (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar20);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar17->children,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      puVar24 = puVar24 + 1;
    } while (puVar24 != puVar7);
  }
  puVar24 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
             ((long)&in_RSI[1].super_BaseExpression.alias.field_2 + 8);
  puVar7 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
           in_RSI[1].super_BaseExpression.query_location.index;
  if (puVar24 != puVar7) {
    do {
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar24);
      (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar20);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)&pBVar17->partitions,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      puVar24 = puVar24 + 1;
    } while (puVar24 != puVar7);
  }
  this_01 = in_RSI[1].return_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar8 = (element_type *)
           in_RSI[1].return_type.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != peVar8) {
    do {
      if (this_01->_vptr_ExtraTypeInfo == (_func_int **)0x0) {
        pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        local_50._M_head_impl = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar17->partitions_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      else {
        pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
        operator->((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)this_01);
        BaseStatistics::ToUnique((BaseStatistics *)&stack0xffffffffffffffb0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar17->partitions_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      _Var11._M_head_impl = local_50._M_head_impl;
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_50._M_head_impl);
        operator_delete(_Var11._M_head_impl);
      }
      this_01 = (element_type *)&this_01->type;
    } while (this_01 != peVar8);
  }
  __args = in_RSI[2].super_BaseExpression._vptr_BaseExpression;
  pp_Var9 = *(_func_int ***)&in_RSI[2].super_BaseExpression.type;
  if (__args != pp_Var9) {
    do {
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)(__args + 1));
      (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar20);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar17->orders,(OrderType *)__args,(OrderByNullType *)((long)__args + 1),
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      __args = __args + 3;
    } while (__args != pp_Var9);
  }
  __args_00 = (BaseStatistics *)
              in_RSI[2].return_type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
  _Var10._M_head_impl =
       in_RSI[2].verification_stats.
       super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>._M_t.
       super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>.
       _M_t.
       super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
       .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
  if (__args_00 != _Var10._M_head_impl) {
    do {
      pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&stack0xffffffffffffffb8);
      pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&(__args_00->type).type_info_);
      (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0,pEVar20);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType_const&,duckdb::OrderByNullType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar17->arg_orders,(OrderType *)__args_00,&(__args_00->type).physical_type_,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &stack0xffffffffffffffb0);
      if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
        (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      __args_00 = (BaseStatistics *)&__args_00->has_null;
    } while (__args_00 != _Var10._M_head_impl);
  }
  if (in_RSI[2].super_BaseExpression.alias._M_string_length == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].super_BaseExpression.alias._M_string_length);
    (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar20);
  }
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar17->filter_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar17->filter_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  WVar1 = in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[2];
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar17->start = WVar1;
  WVar1 = in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[3];
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar17->end = WVar1;
  WVar2 = in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[4];
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar17->exclude_clause = WVar2;
  if (*(long *)((long)&in_RSI[2].super_BaseExpression.alias.field_2 + 8) == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)((long)&in_RSI[2].super_BaseExpression.alias.field_2 + 8));
    (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar20);
  }
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar17->start_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar17->start_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (in_RSI[2].super_BaseExpression.query_location.index == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].super_BaseExpression.query_location);
    (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar20);
  }
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar17->end_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar17->end_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  lVar12._0_1_ = in_RSI[2].return_type.id_;
  lVar12._1_1_ = in_RSI[2].return_type.physical_type_;
  lVar12._2_6_ = *(undefined6 *)&in_RSI[2].return_type.field_0x2;
  if (lVar12 == 0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].return_type);
    (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar20);
  }
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar17->offset_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar17->offset_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  if (local_50._M_head_impl != (Expression *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  if (in_RSI[2].return_type.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    local_50._M_head_impl = (Expression *)0x0;
  }
  else {
    pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                          *)&in_RSI[2].return_type.type_info_);
    (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[0x11])(&stack0xffffffffffffffb0,pEVar20);
  }
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  _Var15._M_head_impl = local_50._M_head_impl;
  local_50._M_head_impl = (Expression *)0x0;
  _Var11._M_head_impl =
       (pBVar17->default_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar17->default_expr).
  super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var15._M_head_impl;
  if (_Var11._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var11._M_head_impl)->super_BaseExpression + 8))();
  }
  if ((BaseStatistics *)local_50._M_head_impl != (BaseStatistics *)0x0) {
    (*((local_50._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
  }
  bVar3 = (bool)in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[0];
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar17->ignore_nulls = bVar3;
  bVar3 = (bool)in_RSI[2].super_BaseExpression.alias.field_2._M_local_buf[1];
  pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
            ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                          *)&stack0xffffffffffffffb8);
  pBVar17->distinct = bVar3;
  this_02 = *(unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
              **)&in_RSI[3].super_BaseExpression.type;
  puVar13 = (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> *
            )in_RSI[3].super_BaseExpression.alias._M_dataplus._M_p;
  if (this_02 != puVar13) {
    do {
      if ((this_02->
          super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
          .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl ==
          (BaseStatistics *)0x0) {
        pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        local_50._M_head_impl = (Expression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar17->expr_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      else {
        pBVar17 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&stack0xffffffffffffffb8);
        unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
        operator->(this_02);
        BaseStatistics::ToUnique((BaseStatistics *)&stack0xffffffffffffffb0);
        ::std::
        vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>,std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,std::default_delete<duckdb::BaseStatistics>,true>>>
                    *)&pBVar17->expr_stats,
                   (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                    *)&stack0xffffffffffffffb0);
      }
      _Var16._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
           (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
           local_50._M_head_impl;
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_50._M_head_impl != (Expression *)0x0) {
        BaseStatistics::~BaseStatistics((BaseStatistics *)local_50._M_head_impl);
        operator_delete((void *)_Var16._M_t.
                                super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>
                                .super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl);
      }
      this_02 = this_02 + 1;
    } while (this_02 != puVar13);
  }
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_head_impl)->_vptr__Sp_counted_base =
       (_func_int **)local_48._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_40._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundWindowExpression::Copy() const {
	auto new_window = make_uniq<BoundWindowExpression>(type, return_type, nullptr, nullptr);
	new_window->CopyProperties(*this);

	if (aggregate) {
		new_window->aggregate = make_uniq<AggregateFunction>(*aggregate);
	}
	if (bind_info) {
		new_window->bind_info = bind_info->Copy();
	}
	for (auto &child : children) {
		new_window->children.push_back(child->Copy());
	}
	for (auto &e : partitions) {
		new_window->partitions.push_back(e->Copy());
	}
	for (auto &ps : partitions_stats) {
		if (ps) {
			new_window->partitions_stats.push_back(ps->ToUnique());
		} else {
			new_window->partitions_stats.push_back(nullptr);
		}
	}
	for (auto &o : orders) {
		new_window->orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	for (auto &o : arg_orders) {
		new_window->arg_orders.emplace_back(o.type, o.null_order, o.expression->Copy());
	}

	new_window->filter_expr = filter_expr ? filter_expr->Copy() : nullptr;

	new_window->start = start;
	new_window->end = end;
	new_window->exclude_clause = exclude_clause;
	new_window->start_expr = start_expr ? start_expr->Copy() : nullptr;
	new_window->end_expr = end_expr ? end_expr->Copy() : nullptr;
	new_window->offset_expr = offset_expr ? offset_expr->Copy() : nullptr;
	new_window->default_expr = default_expr ? default_expr->Copy() : nullptr;
	new_window->ignore_nulls = ignore_nulls;
	new_window->distinct = distinct;

	for (auto &es : expr_stats) {
		if (es) {
			new_window->expr_stats.push_back(es->ToUnique());
		} else {
			new_window->expr_stats.push_back(nullptr);
		}
	}
	return std::move(new_window);
}